

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O1

void __thiscall
QScrollerPrivate::createScrollToSegments
          (QScrollerPrivate *this,qreal v,qreal deltaTime,qreal endPos,Orientation orientation,
          ScrollType type)

{
  QDebug QVar1;
  Type curve;
  QQueue<QScrollerPrivate::ScrollSegment> *this_00;
  long in_FS_OFFSET;
  double deltaPos;
  double startPos;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QDebug local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->ySegments;
  if (orientation == Horizontal) {
    this_00 = &this->xSegments;
  }
  QList<QScrollerPrivate::ScrollSegment>::clear
            (&this_00->super_QList<QScrollerPrivate::ScrollSegment>);
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    QMessageLogger::debug();
    QVar1.stream = local_50.stream;
    QVar2.m_data = (storage_type *)0x1e;
    QVar2.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar2);
    QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_50.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_50.stream,deltaTime);
    if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_50.stream,' ');
    }
    QVar1.stream = local_50.stream;
    QVar3.m_data = (storage_type *)0x3;
    QVar3.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar3);
    QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_50.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_50.stream,endPos);
    if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_50.stream,' ');
    }
    QVar1.stream = local_50.stream;
    QVar4.m_data = (storage_type *)0x2;
    QVar4.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar4);
    QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_50.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_50.stream,orientation);
    if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_50.stream,' ');
    }
    QDebug::~QDebug(&local_50);
  }
  startPos = (&(this->contentPosition).xp)[orientation != Horizontal] +
             (&(this->overshootPosition).xp)[orientation != Horizontal];
  deltaPos = (endPos - startPos) * 0.5;
  pushSegment(this,type,deltaTime * 0.3,1.0,startPos,deltaPos,startPos + deltaPos,InQuad,orientation
             );
  curve = QEasingCurve::type();
  pushSegment(this,type,deltaTime * 0.7,1.0,startPos + deltaPos,deltaPos,endPos,curve,orientation);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollerPrivate::createScrollToSegments(qreal v, qreal deltaTime, qreal endPos,
                                              Qt::Orientation orientation, ScrollType type)
{
    Q_UNUSED(v);

    if (orientation == Qt::Horizontal)
        xSegments.clear();
    else
        ySegments.clear();

    qCDebug(lcScroller) << "+++ createScrollToSegments: t:" << deltaTime << "ep:"
                        << endPos << "o:" << int(orientation);

    const QScrollerPropertiesPrivate *sp = properties.d.data();

    qreal startPos = (orientation == Qt::Horizontal) ? contentPosition.x() + overshootPosition.x()
                                                     : contentPosition.y() + overshootPosition.y();
    qreal deltaPos = (endPos - startPos) / 2;

    pushSegment(type, deltaTime * qreal(0.3), qreal(1.0), startPos, deltaPos, startPos + deltaPos,
                QEasingCurve::InQuad, orientation);
    pushSegment(type, deltaTime * qreal(0.7), qreal(1.0), startPos + deltaPos, deltaPos, endPos,
                sp->scrollingCurve.type(), orientation);
}